

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_write(p_ply ply,double value)

{
  p_ply_property ptVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  e_ply_type eVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  p_ply_element ptVar13;
  
  lVar3 = ply->welement;
  if (lVar3 <= ply->nelements) {
    lVar7 = ply->wproperty;
    if (lVar7 <= ply->element[lVar3].nproperties) {
      ptVar13 = ply->element + lVar3;
      ptVar1 = ptVar13->property + lVar7;
      eVar5 = ptVar13->property[lVar7].type;
      if (eVar5 == PLY_LIST) {
        if (ply->wvalue_index == 0) {
          eVar5 = ptVar1->length_type;
          ply->wlength = (long)value;
        }
        else {
          eVar5 = ptVar1->value_type;
        }
      }
      else {
        ply->wlength = 0;
      }
      iVar6 = (*ply->odriver->ohandler[(int)eVar5])(ply,value);
      if (iVar6 == 0) {
        bVar10 = false;
        ply_ferror(ply,"Failed writing %s of %s %d (%s: %s)",ptVar1,ptVar13,ply->winstance_index,
                   ply->odriver->name,ply_type_list[(int)eVar5]);
      }
      else {
        lVar3 = ply->wvalue_index;
        lVar7 = ply->wproperty;
        ply->wvalue_index = lVar3 + 1;
        if (ply->wlength <= lVar3) {
          lVar7 = lVar7 + 1;
          ply->wvalue_index = 0;
          ply->wproperty = lVar7;
        }
        lVar3 = ptVar13->nproperties;
        if (lVar7 < lVar3) {
          lVar8 = ply->winstance_index;
        }
        else {
          ply->wproperty = 0;
          lVar8 = ply->winstance_index + 1;
          ply->winstance_index = lVar8;
        }
        if (ptVar13->ninstances <= lVar8) {
          ply->winstance_index = 0;
          lVar8 = ply->welement;
          lVar4 = ply->nelements;
          lVar11 = lVar8 + 1;
          if (lVar8 + 1 < lVar4) {
            lVar11 = lVar4;
          }
          lVar12 = lVar8 * 0x118 + 0x218;
          do {
            lVar8 = lVar8 + 1;
            lVar9 = lVar11;
            if (lVar4 <= lVar8) break;
            pcVar2 = ply->element->name + lVar12;
            lVar12 = lVar12 + 0x118;
            lVar9 = lVar8;
          } while (*(long *)pcVar2 == 0);
          ply->welement = lVar9;
        }
        bVar10 = true;
        if (ply->storage_mode == PLY_ASCII) {
          if (lVar7 < lVar3) {
            iVar6 = 0x20;
          }
          else {
            iVar6 = 10;
          }
          iVar6 = putc(iVar6,(FILE *)ply->fp);
          bVar10 = 0 < iVar6;
        }
      }
      goto LAB_00358151;
    }
  }
  bVar10 = false;
LAB_00358151:
  return (int)bVar10;
}

Assistant:

int ply_write(p_ply ply, double value) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    int type = -1;
    int breakafter = 0;
    int spaceafter = 1;
    if (ply->welement > ply->nelements) return 0;
    element = &ply->element[ply->welement];
    if (ply->wproperty > element->nproperties) return 0;
    property = &element->property[ply->wproperty];
    if (property->type == PLY_LIST) {
        if (ply->wvalue_index == 0) {
            type = property->length_type;
            ply->wlength = (long)value;
        } else
            type = property->value_type;
    } else {
        type = property->type;
        ply->wlength = 0;
    }
    if (!ply->odriver->ohandler[type](ply, value)) {
        ply_ferror(ply, "Failed writing %s of %s %d (%s: %s)", property->name,
                   element->name, ply->winstance_index, ply->odriver->name,
                   ply_type_list[type]);
        return 0;
    }
    ply->wvalue_index++;
    if (ply->wvalue_index > ply->wlength) {
        ply->wvalue_index = 0;
        ply->wproperty++;
    }
    if (ply->wproperty >= element->nproperties) {
        ply->wproperty = 0;
        ply->winstance_index++;
        breakafter = 1;
        spaceafter = 0;
    }
    if (ply->winstance_index >= element->ninstances) {
        ply->winstance_index = 0;
        do {
            ply->welement++;
            element = &ply->element[ply->welement];
        } while (ply->welement < ply->nelements && !element->ninstances);
    }
    if (ply->storage_mode == PLY_ASCII) {
        return (!spaceafter || putc(' ', ply->fp) > 0) &&
               (!breakafter || putc('\n', ply->fp) > 0);
    } else {
        return 1;
    }
}